

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutGeneration.cpp
# Opt level: O2

bool __thiscall HighsCutGeneration::separateLiftedMixedIntegerCover(HighsCutGeneration *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  HighsCDouble *v;
  double *pdVar1;
  int *piVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end;
  pointer piVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  double *pdVar9;
  pointer piVar10;
  size_type sVar11;
  ulong uVar12;
  pointer pHVar13;
  ulong uVar14;
  HighsInt i;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  size_type __new_size;
  ulong uVar19;
  double dVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  HighsCDouble HVar27;
  HighsCDouble mu_1;
  HighsCDouble local_220;
  uint local_20c;
  HighsCDouble ulminusetaplusone_1;
  HighsCDouble mcplus;
  HighsCDouble local_1c8;
  HighsCDouble local_1b8;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> m;
  double local_190;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> u;
  ulong local_158;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> a;
  HighsCDouble local_128;
  double local_118;
  HighsCDouble al;
  HighsCDouble ulminusetaplusone;
  vector<int,_std::allocator<int>_> *__range1;
  HighsCDouble cplusthreshold;
  HighsCDouble mu;
  vector<unsigned_char,_std::allocator<unsigned_char>_> coverflag;
  HighsCDouble local_a8;
  HighsCDouble local_90;
  HighsCDouble local_80;
  HighsCDouble local_70;
  HighsCDouble local_60;
  HighsCDouble local_50;
  HighsCDouble mlu;
  
  this->integralSupport = false;
  this->integralCoefficients = false;
  uVar16 = (long)(this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  coverflag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  coverflag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  coverflag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&coverflag,(long)this->rowlen);
  this_00 = &this->cover;
  uVar15 = uVar16 >> 2;
  piVar2 = (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar8 = (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar8 != piVar2; piVar8 = piVar8 + 1) {
    coverflag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[*piVar8] = '\x01';
  }
  begin._M_current =
       (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  end._M_current =
       (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (begin._M_current != end._M_current) {
    iVar6 = pdqsort_detail::log2<long>((long)end._M_current - (long)begin._M_current >> 2);
    pdqsort_detail::
    pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::separateLiftedMixedIntegerCover()::__0,true>
              (begin,end,(anon_class_8_1_8991fb9c)this,iVar6,true);
  }
  a.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  a.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  a.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  u.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  u.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  u.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  m.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  m.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  m.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sVar11 = (size_type)(int)uVar15;
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize(&a,sVar11);
  __new_size = (long)(uVar16 * 0x40000000 + 0x100000000) >> 0x20;
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize(&u,__new_size);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize(&m,__new_size);
  uVar15 = uVar15 & 0xffffffff;
  local_a8.hi = 0.0;
  local_a8.lo = 0.0;
  lVar18 = 2;
  dVar23 = 0.0;
  dVar25 = 0.0;
  for (lVar17 = 0; uVar15 << 4 != lVar17; lVar17 = lVar17 + 0x10) {
    iVar6 = *(int *)((long)(this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar18 + -2);
    *(double *)
     ((long)u.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
            super__Vector_impl_data._M_start + lVar18 * 4 + -8) = dVar25;
    *(double *)
     ((long)&(u.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
              super__Vector_impl_data._M_start)->hi + lVar18 * 4) = dVar23;
    pdVar9 = (double *)
             ((long)m.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar18 * 4 + -8);
    *pdVar9 = local_a8.hi;
    pdVar9[1] = local_a8.lo;
    *(double *)
     ((long)a.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
            super__Vector_impl_data._M_start + lVar18 * 4 + -8) = this->vals[iVar6];
    *(undefined8 *)
     ((long)&(a.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
              super__Vector_impl_data._M_start)->hi + lVar18 * 4) = 0;
    dVar26 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar6];
    HVar27 = HighsCDouble::operator*
                       ((HighsCDouble *)
                        ((long)&(a.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->hi + lVar17),dVar26);
    mu_1.lo = HVar27.lo;
    mu_1.hi = HVar27.hi;
    HighsCDouble::operator+=(&local_a8,&mu_1);
    dVar4 = dVar25 + dVar26;
    dVar23 = dVar23 + (dVar25 - (dVar4 - dVar26)) + (dVar26 - (dVar4 - (dVar4 - dVar26)));
    lVar18 = lVar18 + 4;
    dVar25 = dVar4;
  }
  u.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.super__Vector_impl_data.
  _M_start[sVar11].hi = dVar25;
  u.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.super__Vector_impl_data.
  _M_start[sVar11].lo = dVar23;
  m.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.super__Vector_impl_data.
  _M_start[sVar11].hi = local_a8.hi;
  m.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.super__Vector_impl_data.
  _M_start[sVar11].lo = local_a8.lo;
  v = &this->lambda;
  local_190 = 0.0;
  local_20c = CONCAT31(local_20c._1_3_,1);
  local_158 = 0xffffffffffffffff;
  uVar19 = 0xffffffff;
  for (uVar16 = 0; iVar6 = (int)uVar19, uVar16 != uVar15; uVar16 = uVar16 + 1) {
    iVar6 = (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar16];
    dVar25 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar6];
    dVar26 = dVar25 - this->feastol;
    dVar23 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar6];
    if ((dVar23 < dVar26) || ((local_20c & 1) != 0)) {
      dVar4 = this->vals[iVar6] * dVar25;
      HVar27 = operator-(dVar4,v);
      mu_1.lo = HVar27.lo;
      mu_1.hi = HVar27.hi;
      if ((this->feastol * 10.0 < mu_1.hi + mu_1.lo) &&
         (this->feastol * 1000.0 <= ABS(this->vals[iVar6]))) {
        HVar27 = HighsCDouble::operator/(&mu_1,this->vals[iVar6]);
        dVar20 = HVar27.hi + HVar27.lo;
        local_118 = this->feastol;
        dVar5 = trunc(dVar20);
        dVar24 = ABS(dVar20 - dVar5);
        dVar5 = 1.0 - dVar24;
        if (dVar24 <= 1.0 - dVar24) {
          dVar5 = dVar24;
        }
        if (local_118 < dVar5) {
          dVar20 = ceil(dVar20);
          local_220.lo = 0.0;
          local_220.hi = dVar25;
          HVar27 = HighsCDouble::operator-(&local_220,dVar20);
          mcplus.lo = HVar27.lo;
          mcplus.hi = HVar27.hi;
          HVar27 = HighsCDouble::operator+(&mcplus,1.0);
          ulminusetaplusone_1.lo = HVar27.lo;
          ulminusetaplusone_1.hi = HVar27.hi;
          HVar27 = HighsCDouble::operator*(&ulminusetaplusone_1,this->vals[iVar6]);
          piVar3 = (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar25 = HVar27.hi + HVar27.lo;
          pdVar9 = this->vals;
          piVar10 = piVar3;
          uVar14 = (long)(this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar3 >> 2;
          while (uVar12 = uVar14, 0 < (long)uVar12) {
            uVar14 = uVar12 >> 1;
            if (dVar25 < pdVar9[piVar10[uVar14]] || dVar25 == pdVar9[piVar10[uVar14]]) {
              piVar10 = piVar10 + uVar14 + 1;
              uVar14 = ~uVar14 + uVar12;
            }
          }
          uVar14 = (ulong)((long)piVar10 - (long)piVar3) >> 2;
          pdVar1 = (double *)
                   ((long)&(m.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                            _M_impl.super__Vector_impl_data._M_start)->hi +
                   (((long)piVar10 - (long)piVar3) * 0x40000000 >> 0x1c));
          mcplus.hi = *pdVar1;
          mcplus.lo = pdVar1[1];
          if ((long)uVar16 < (long)(int)uVar14) {
            HighsCDouble::operator-=(&mcplus,dVar4);
            pdVar9 = this->vals;
          }
          HVar27 = HighsCDouble::operator+(&mcplus,dVar20 * pdVar9[iVar6]);
          dVar25 = HVar27.lo + HVar27.hi;
          if ((local_190 < dVar25) || ((dVar23 < dVar26 && ((local_20c & 1) != 0)))) {
            local_20c = CONCAT31(local_20c._1_3_,dVar23 >= dVar26);
            uVar19 = uVar16 & 0xffffffff;
            local_190 = dVar25;
            local_158 = uVar14;
          }
        }
      }
    }
  }
  if (iVar6 != -1) {
    lVar18 = (long)iVar6;
    iVar7 = (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar18];
    al.hi = this->vals[iVar7];
    al.lo = 0.0;
    dVar25 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar7];
    HVar27 = HighsCDouble::operator*(&al,dVar25);
    mlu.lo = HVar27.lo;
    mlu.hi = HVar27.hi;
    HVar27 = HighsCDouble::operator-(&mlu,v);
    mu.lo = HVar27.lo;
    mu.hi = HVar27.hi;
    iVar7 = (int)local_158;
    sVar11 = (size_type)iVar7;
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize(&a,sVar11);
    std::vector<int,_std::allocator<int>_>::resize(this_00,sVar11);
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize(&u,(long)(iVar7 + 1));
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize(&m,(long)(iVar7 + 1));
    if (iVar6 < iVar7) {
      pHVar13 = a.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                super__Vector_impl_data._M_start + lVar18 + 1;
      if (pHVar13 !=
          a.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        memmove(a.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                super__Vector_impl_data._M_start + lVar18,pHVar13,
                (long)a.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pHVar13);
      }
      a.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
      super__Vector_impl_data._M_finish =
           a.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
      std::vector<int,_std::allocator<int>_>::erase
                (this_00,(const_iterator)
                         ((this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start + lVar18));
      pHVar13 = u.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                super__Vector_impl_data._M_start + lVar18 + 2;
      if (pHVar13 !=
          u.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        memmove(u.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                super__Vector_impl_data._M_start + lVar18 + 1,pHVar13,
                (long)u.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pHVar13);
      }
      u.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
      super__Vector_impl_data._M_finish =
           u.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
      pHVar13 = m.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                super__Vector_impl_data._M_start + lVar18 + 2;
      if (pHVar13 !=
          m.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        memmove(m.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                super__Vector_impl_data._M_start + lVar18 + 1,pHVar13,
                (long)m.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pHVar13);
      }
      m.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
      super__Vector_impl_data._M_finish =
           m.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
      lVar17 = lVar18 * 0x10;
      while( true ) {
        lVar18 = lVar18 + 1;
        if ((long)sVar11 <= lVar18) break;
        HighsCDouble::operator-=
                  ((HighsCDouble *)
                   ((long)&u.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl
                           .super__Vector_impl_data._M_start[1].hi + lVar17),dVar25);
        HighsCDouble::operator-=
                  ((HighsCDouble *)
                   ((long)&m.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl
                           .super__Vector_impl_data._M_start[1].hi + lVar17),&mlu);
        lVar17 = lVar17 + 0x10;
      }
    }
    uVar15 = (long)a.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)a.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                   super__Vector_impl_data._M_start;
    HVar27 = HighsCDouble::operator/(&mu,&al);
    dVar23 = HVar27.hi + HVar27.lo;
    dVar26 = ceil(dVar23);
    dVar23 = floor(dVar23);
    ulminusetaplusone_1.hi = al.hi;
    ulminusetaplusone_1.lo = al.lo;
    HVar27 = HighsCDouble::operator*(&ulminusetaplusone_1,dVar23);
    mu_1.lo = HVar27.lo;
    mu_1.hi = HVar27.hi;
    HVar27 = HighsCDouble::operator-(&mu,&mu_1);
    local_1c8.lo = HVar27.lo;
    local_1c8.hi = HVar27.hi;
    if (local_1c8.hi + local_1c8.lo < 0.0) {
      local_1c8.hi = 0.0;
      local_1c8.lo = 0.0;
    }
    ulminusetaplusone_1.lo = 0.0;
    ulminusetaplusone_1.hi = dVar25;
    HVar27 = HighsCDouble::operator-(&ulminusetaplusone_1,dVar26);
    mu_1.lo = HVar27.lo;
    mu_1.hi = HVar27.hi;
    HVar27 = HighsCDouble::operator+(&mu_1,1.0);
    ulminusetaplusone.lo = HVar27.lo;
    ulminusetaplusone.hi = HVar27.hi;
    HVar27 = HighsCDouble::operator*(&ulminusetaplusone,&al);
    cplusthreshold.lo = HVar27.lo;
    cplusthreshold.hi = HVar27.hi;
    dVar23 = floor((dVar26 - dVar25) + -0.5);
    dVar4 = floor((dVar25 - dVar26) + 0.5);
    mcplus.lo = 0.0;
    mcplus.hi = dVar25;
    HVar27 = HighsCDouble::operator-(&mcplus,dVar26);
    ulminusetaplusone_1.lo = HVar27.lo;
    ulminusetaplusone_1.hi = HVar27.hi;
    HVar27 = HighsCDouble::operator*(&ulminusetaplusone_1,&local_1c8);
    mu_1.lo = HVar27.lo;
    mu_1.hi = HVar27.hi;
    HVar27 = HighsCDouble::operator-(&mu_1,v);
    (this->rhs).hi = HVar27.hi;
    (this->rhs).lo = HVar27.lo;
    dVar25 = (double)(long)(int)(uVar15 >> 4);
    uVar15 = 0;
    local_118 = 0.0;
    if (0 < (long)dVar25) {
      local_118 = dVar25;
    }
    this->integralSupport = true;
    this->integralCoefficients = false;
    for (; uVar15 != (uint)this->rowlen; uVar15 = uVar15 + 1) {
      dVar26 = this->vals[uVar15];
      if ((dVar26 != 0.0) || (NAN(dVar26))) {
        if ((this->isintegral).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar15] == '\0') {
          if (0.0 <= dVar26) {
            this->vals[uVar15] = 0.0;
          }
          else {
            this->integralSupport = false;
          }
        }
        else if (coverflag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar15] == '\0') {
          for (dVar20 = 0.0; dVar20 != local_118; dVar20 = (double)((long)dVar20 + 1)) {
            local_20c = (uint)(this->upper).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start
                              [(this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[(long)dVar20]];
            for (iVar7 = 0;
                pHVar13 = m.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                          super__Vector_impl_data._M_start, iVar7 <= (int)local_20c;
                iVar7 = iVar7 + 1) {
              HVar27 = HighsCDouble::operator*
                                 (a.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                                  _M_impl.super__Vector_impl_data._M_start + (long)dVar20,
                                  (double)iVar7);
              ulminusetaplusone_1.lo = HVar27.lo;
              ulminusetaplusone_1.hi = HVar27.hi;
              HVar27 = HighsCDouble::operator+(pHVar13 + (long)dVar20,&ulminusetaplusone_1);
              mu_1.lo = HVar27.lo;
              mu_1.hi = HVar27.hi;
              HVar27 = HighsCDouble::operator+
                                 (u.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                                  _M_impl.super__Vector_impl_data._M_start + (long)dVar20,
                                  (double)iVar7);
              ulminusetaplusone_1.lo = HVar27.lo;
              ulminusetaplusone_1.hi = HVar27.hi;
              HVar27 = HighsCDouble::operator+
                                 (&mu_1,a.
                                        super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>
                                        ._M_impl.super__Vector_impl_data._M_start + (long)dVar20);
              local_220.lo = HVar27.lo;
              local_220.hi = HVar27.hi;
              HVar27 = HighsCDouble::operator-(&local_220,&cplusthreshold);
              mcplus.lo = HVar27.lo;
              mcplus.hi = HVar27.hi;
              if (dVar26 <= mcplus.hi + mcplus.lo) {
                HVar27 = HighsCDouble::operator*(&ulminusetaplusone_1,&ulminusetaplusone);
                local_220.lo = HVar27.lo;
                local_220.hi = HVar27.hi;
                HVar27 = HighsCDouble::operator-(&al,&local_1c8);
                local_1b8.lo = HVar27.lo;
                local_1b8.hi = HVar27.hi;
                HVar27 = HighsCDouble::operator*(&local_220,&local_1b8);
                dVar26 = HVar27.lo;
                uVar21 = HVar27.hi._0_4_;
                uVar22 = HVar27.hi._4_4_;
                goto LAB_00291818;
              }
              HVar27 = operator-(dVar26,&mcplus);
              local_220.lo = HVar27.lo;
              local_220.hi = HVar27.hi;
              HVar27 = HighsCDouble::operator/(&local_220,&al);
              lVar18 = (long)(HVar27.hi + HVar27.lo);
              while (lVar18 + -1 <= (long)dVar4) {
                dVar5 = (double)(lVar18 + -1);
                HVar27 = HighsCDouble::operator*(&al,dVar5);
                local_1b8.lo = HVar27.lo;
                local_1b8.hi = HVar27.hi;
                HVar27 = HighsCDouble::operator+(&mcplus,&local_1b8);
                local_220.lo = HVar27.lo;
                local_220.hi = HVar27.hi;
                HVar27 = HighsCDouble::operator+(&local_220,&local_1c8);
                if (dVar26 <= HVar27.hi + HVar27.lo) {
                  HVar27 = HighsCDouble::operator*(&ulminusetaplusone_1,&ulminusetaplusone);
                  local_1b8.lo = HVar27.lo;
                  local_1b8.hi = HVar27.hi;
                  HVar27 = HighsCDouble::operator+(&local_1b8,dVar5);
                  local_220.lo = HVar27.lo;
                  local_220.hi = HVar27.hi;
                  HVar27 = HighsCDouble::operator-(&al,&local_1c8);
                  local_128.lo = HVar27.lo;
                  local_128.hi = HVar27.hi;
                  HVar27 = HighsCDouble::operator*(&local_220,&local_128);
                  dVar26 = HVar27.lo;
                  uVar21 = HVar27.hi._0_4_;
                  uVar22 = HVar27.hi._4_4_;
                  goto LAB_00291818;
                }
                dVar5 = (double)lVar18;
                HVar27 = HighsCDouble::operator*(&al,dVar5);
                local_220.lo = HVar27.lo;
                local_220.hi = HVar27.hi;
                HVar27 = HighsCDouble::operator+(&mcplus,&local_220);
                lVar18 = lVar18 + 1;
                if (dVar26 <= HVar27.hi + HVar27.lo) {
                  HVar27 = HighsCDouble::operator*(&ulminusetaplusone_1,&ulminusetaplusone);
                  local_70.lo = HVar27.lo;
                  local_70.hi = HVar27.hi;
                  HVar27 = HighsCDouble::operator-(&al,&local_1c8);
                  local_80.lo = HVar27.lo;
                  local_80.hi = HVar27.hi;
                  HVar27 = HighsCDouble::operator*(&local_70,&local_80);
                  local_60.lo = HVar27.lo;
                  local_60.hi = HVar27.hi;
                  HVar27 = HighsCDouble::operator+(&local_60,dVar26);
                  local_50.lo = HVar27.lo;
                  local_50.hi = HVar27.hi;
                  HVar27 = HighsCDouble::operator-(&local_50,&mu_1);
                  local_128.lo = HVar27.lo;
                  local_128.hi = HVar27.hi;
                  HVar27 = HighsCDouble::operator-
                                     (&local_128,
                                      a.
                                      super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>
                                      ._M_impl.super__Vector_impl_data._M_start + (long)dVar20);
                  local_1b8.lo = HVar27.lo;
                  local_1b8.hi = HVar27.hi;
                  HVar27 = HighsCDouble::operator+(&local_1b8,&cplusthreshold);
                  local_220.lo = HVar27.lo;
                  local_220.hi = HVar27.hi;
                  HVar27 = HighsCDouble::operator*(&local_1c8,dVar5);
                  local_90.lo = HVar27.lo;
                  local_90.hi = HVar27.hi;
                  HVar27 = HighsCDouble::operator-(&local_220,&local_90);
                  dVar26 = HVar27.lo;
                  uVar21 = HVar27.hi._0_4_;
                  uVar22 = HVar27.hi._4_4_;
                  goto LAB_00291818;
                }
              }
            }
          }
          HVar27 = operator-(dVar26,m.
                                    super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                                    _M_impl.super__Vector_impl_data._M_start + (long)dVar25);
          mu_1.lo = HVar27.lo;
          mu_1.hi = HVar27.hi;
          HVar27 = HighsCDouble::operator/(&mu_1,&al);
          lVar18 = (long)(HVar27.hi + HVar27.lo);
          do {
            pHVar13 = m.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                      super__Vector_impl_data._M_start;
            HVar27 = HighsCDouble::operator*(&al,(double)(lVar18 + -1));
            ulminusetaplusone_1.lo = HVar27.lo;
            ulminusetaplusone_1.hi = HVar27.hi;
            HVar27 = HighsCDouble::operator+(pHVar13 + (long)dVar25,&ulminusetaplusone_1);
            mu_1.lo = HVar27.lo;
            mu_1.hi = HVar27.hi;
            HVar27 = HighsCDouble::operator+(&mu_1,&local_1c8);
            pHVar13 = m.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (dVar26 <= HVar27.hi + HVar27.lo) {
              HVar27 = HighsCDouble::operator*
                                 (u.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                                  _M_impl.super__Vector_impl_data._M_start + (long)dVar25,
                                  &ulminusetaplusone);
              ulminusetaplusone_1.lo = HVar27.lo;
              ulminusetaplusone_1.hi = HVar27.hi;
              HVar27 = HighsCDouble::operator+(&ulminusetaplusone_1,(double)(lVar18 + -1));
              mu_1.lo = HVar27.lo;
              mu_1.hi = HVar27.hi;
              HVar27 = HighsCDouble::operator-(&al,&local_1c8);
              mcplus.lo = HVar27.lo;
              mcplus.hi = HVar27.hi;
              HVar27 = HighsCDouble::operator*(&mu_1,&mcplus);
              dVar26 = HVar27.lo;
              uVar21 = HVar27.hi._0_4_;
              uVar22 = HVar27.hi._4_4_;
              goto LAB_00291818;
            }
            dVar20 = (double)lVar18;
            HVar27 = HighsCDouble::operator*(&al,dVar20);
            mu_1.lo = HVar27.lo;
            mu_1.hi = HVar27.hi;
            HVar27 = HighsCDouble::operator+(pHVar13 + (long)dVar25,&mu_1);
            lVar18 = lVar18 + 1;
          } while (HVar27.hi + HVar27.lo < dVar26);
          HVar27 = HighsCDouble::operator*
                             (u.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                              _M_impl.super__Vector_impl_data._M_start + (long)dVar25,
                              &ulminusetaplusone);
          local_220.lo = HVar27.lo;
          local_220.hi = HVar27.hi;
          HVar27 = HighsCDouble::operator-(&al,&local_1c8);
          local_1b8.lo = HVar27.lo;
          local_1b8.hi = HVar27.hi;
          HVar27 = HighsCDouble::operator*(&local_220,&local_1b8);
          mcplus.lo = HVar27.lo;
          mcplus.hi = HVar27.hi;
          HVar27 = HighsCDouble::operator+(&mcplus,dVar26);
          ulminusetaplusone_1.lo = HVar27.lo;
          ulminusetaplusone_1.hi = HVar27.hi;
          HVar27 = HighsCDouble::operator-
                             (&ulminusetaplusone_1,
                              m.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                              _M_impl.super__Vector_impl_data._M_start + (long)dVar25);
          mu_1.lo = HVar27.lo;
          mu_1.hi = HVar27.hi;
          HVar27 = HighsCDouble::operator*(&local_1c8,dVar20);
          local_128.lo = HVar27.lo;
          local_128.hi = HVar27.hi;
          HVar27 = HighsCDouble::operator-(&mu_1,&local_128);
          dVar26 = HVar27.lo;
          uVar21 = HVar27.hi._0_4_;
          uVar22 = HVar27.hi._4_4_;
LAB_00291818:
          this->vals[uVar15] = (double)CONCAT44(uVar22,uVar21) + dVar26;
        }
        else {
          dVar26 = -dVar26;
          lVar18 = (long)(dVar26 / (al.hi + al.lo));
          if (-2 < lVar18) {
            lVar18 = -1;
          }
          for (; (int)dVar23 <= lVar18; lVar18 = lVar18 + -1) {
            dVar20 = (double)lVar18;
            HVar27 = HighsCDouble::operator*(&al,dVar20);
            mu_1.lo = HVar27.lo;
            mu_1.hi = HVar27.hi;
            HVar27 = HighsCDouble::operator+(&mu_1,&local_1c8);
            if (HVar27.hi + HVar27.lo <= dVar26) {
              HVar27 = HighsCDouble::operator*(&local_1c8,(double)(lVar18 + 1));
              mu_1.lo = HVar27.lo;
              mu_1.hi = HVar27.hi;
              HVar27 = operator-(dVar26,&mu_1);
              dVar26 = HVar27.lo;
              uVar21 = HVar27.hi._0_4_;
              uVar22 = HVar27.hi._4_4_;
              goto LAB_00291629;
            }
            HVar27 = HighsCDouble::operator*(&al,dVar20);
            if (HVar27.hi + HVar27.lo <= dVar26) {
              HVar27 = HighsCDouble::operator-(&al,&local_1c8);
              mu_1.lo = HVar27.lo;
              mu_1.hi = HVar27.hi;
              HVar27 = HighsCDouble::operator*(&mu_1,dVar20);
              dVar26 = HVar27.lo;
              uVar21 = HVar27.hi._0_4_;
              uVar22 = HVar27.hi._4_4_;
              goto LAB_00291629;
            }
          }
          HVar27 = HighsCDouble::operator-(&al,&local_1c8);
          mu_1.lo = HVar27.lo;
          mu_1.hi = HVar27.hi;
          HVar27 = HighsCDouble::operator*(&mu_1,(double)(int)dVar23);
          dVar26 = HVar27.lo;
          uVar21 = HVar27.hi._0_4_;
          uVar22 = HVar27.hi._4_4_;
LAB_00291629:
          dVar26 = -((double)CONCAT44(uVar22,uVar21) + dVar26);
          this->vals[uVar15] = dVar26;
          HighsCDouble::operator+=
                    (&this->rhs,
                     (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar15] * dVar26);
        }
      }
    }
  }
  std::_Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>::~_Vector_base
            (&m.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>);
  std::_Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>::~_Vector_base
            (&u.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>);
  std::_Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>::~_Vector_base
            (&a.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&coverflag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return iVar6 != -1;
}

Assistant:

bool HighsCutGeneration::separateLiftedMixedIntegerCover() {
  // initialize indicators
  integralSupport = false;
  integralCoefficients = false;

  HighsInt coversize = cover.size();

  HighsInt l = -1;

  std::vector<uint8_t> coverflag;
  coverflag.resize(rowlen);
  for (HighsInt i : cover) coverflag[i] = 1;

  auto comp = [&](HighsInt a, HighsInt b) { return vals[a] > vals[b]; };
  pdqsort_branchless(cover.begin(), cover.end(), comp);

  std::vector<HighsCDouble> a;
  std::vector<HighsCDouble> u;
  std::vector<HighsCDouble> m;

  a.resize(coversize);
  u.resize(coversize + 1);
  m.resize(coversize + 1);

  HighsCDouble usum = 0.0;
  HighsCDouble msum = 0.0;
  // set up the partial sums of the upper bounds, and the contributions
  for (HighsInt c = 0; c != coversize; ++c) {
    HighsInt i = cover[c];

    u[c] = usum;
    m[c] = msum;
    a[c] = vals[i];
    double ub = upper[i];
    usum += ub;
    msum += ub * a[c];
  }

  u[coversize] = usum;
  m[coversize] = msum;

  // determine which variable in the cover we want to create the MIR inequality
  // from which we lift we try to select a variable to have the highest chance
  // of satisfying the facet conditions for the superadditive lifting function
  // gamma to be satisfied.
  HighsInt lpos = -1;
  HighsInt bestlCplusend = -1;
  double bestlVal = 0.0;
  bool bestlAtUpper = true;

  for (HighsInt i = 0; i != coversize; ++i) {
    HighsInt j = cover[i];
    double ub = upper[j];

    bool atUpper = solval[j] >= ub - feastol;
    if (atUpper && !bestlAtUpper) continue;

    double mju = ub * vals[j];
    HighsCDouble mu = mju - lambda;

    if (mu <= 10 * feastol) continue;
    if (std::abs(vals[j]) < 1000 * feastol) continue;

    double mudival = double(mu / vals[j]);
    if (HighsIntegers::isIntegral(mudival, feastol)) continue;
    double eta = ceil(mudival);

    HighsCDouble ulminusetaplusone = HighsCDouble(ub) - eta + 1.0;
    HighsCDouble cplusthreshold = ulminusetaplusone * vals[j];

    HighsInt cplusend =
        std::upper_bound(cover.begin(), cover.end(), double(cplusthreshold),
                         [&](double cplusthreshold, HighsInt i) {
                           return cplusthreshold > vals[i];
                         }) -
        cover.begin();

    HighsCDouble mcplus = m[cplusend];
    if (i < cplusend) mcplus -= mju;

    double jlVal = double(mcplus + eta * vals[j]);

    if (jlVal > bestlVal || (!atUpper && bestlAtUpper)) {
      lpos = i;
      bestlCplusend = cplusend;
      bestlVal = jlVal;
      bestlAtUpper = atUpper;
    }
  }

  if (lpos == -1) return false;

  l = cover[lpos];
  HighsCDouble al = vals[l];
  double upperl = upper[l];
  HighsCDouble mlu = upperl * al;
  HighsCDouble mu = mlu - lambda;

  a.resize(bestlCplusend);
  cover.resize(bestlCplusend);
  u.resize(bestlCplusend + 1);
  m.resize(bestlCplusend + 1);

  if (lpos < bestlCplusend) {
    a.erase(a.begin() + lpos);
    cover.erase(cover.begin() + lpos);
    u.erase(u.begin() + lpos + 1);
    m.erase(m.begin() + lpos + 1);
    for (HighsInt i = lpos + 1; i < bestlCplusend; ++i) {
      u[i] -= upperl;
      m[i] -= mlu;
    }
  }

  HighsInt cplussize = a.size();

  assert(mu > 10 * feastol);

  double mudival = double(mu / al);
  double eta = ceil(mudival);
  HighsCDouble r = mu - floor(mudival) * HighsCDouble(al);
  // we multiply with r and it is important that it does not flip the sign
  // so we safe guard against tiny numerical errors here
  if (r < 0) r = 0;

  HighsCDouble ulminusetaplusone = HighsCDouble(upperl) - eta + 1.0;
  HighsCDouble cplusthreshold = ulminusetaplusone * al;

  HighsInt kmin = floor(eta - upperl - 0.5);

  auto phi_l = [&](double a) {
    assert(a < 0);

    int64_t k = std::min(int64_t(a / double(al)), int64_t(-1));

    for (; k >= kmin; --k) {
      if (a >= k * al + r) {
        assert(a < (k + 1) * al);
        return double(a - (k + 1) * r);
      }

      if (a >= k * al) {
        assert(a < k * al + r);
        return double(k * (al - r));
      }
    }

    assert(a <= -lambda + epsilon);
    return double(kmin * (al - r));
  };

  int64_t kmax = floor(upperl - eta + 0.5);

  auto gamma_l = [&](double z) {
    assert(z > 0);
    for (HighsInt i = 0; i < cplussize; ++i) {
      HighsInt upperi = upper[cover[i]];

      for (HighsInt h = 0; h <= upperi; ++h) {
        HighsCDouble mih = m[i] + h * a[i];
        HighsCDouble uih = u[i] + h;
        HighsCDouble mihplusdeltai = mih + a[i] - cplusthreshold;
        if (z <= mihplusdeltai) {
          assert(mih <= z + epsilon);
          return double(uih * ulminusetaplusone * (al - r));
        }

        int64_t k = ((int64_t)(double)((z - mihplusdeltai) / al)) - 1;
        for (; k <= kmax; ++k) {
          if (z <= mihplusdeltai + k * al + r) {
            assert(mihplusdeltai + k * al <= z);
            return double((uih * ulminusetaplusone + k) * (al - r));
          }

          if (z <= mihplusdeltai + (k + 1) * al) {
            assert(mihplusdeltai + k * al + r <= z);
            return double((uih * ulminusetaplusone) * (al - r) + z - mih -
                          a[i] + cplusthreshold - (k + 1) * r);
          }
        }
      }
    }

    int64_t p = ((int64_t)(double)((z - m[cplussize]) / al)) - 1;
    for (;; ++p) {
      if (z <= m[cplussize] + p * al + r) {
        assert(m[cplussize] + p * al <= z);
        return double((u[cplussize] * ulminusetaplusone + p) * (al - r));
      }

      if (z <= m[cplussize] + (p + 1) * al) {
        assert(m[cplussize] + p * al + r <= z);
        return double((u[cplussize] * ulminusetaplusone) * (al - r) + z -
                      m[cplussize] - (p + 1) * r);
      }
    }
  };

  rhs = (HighsCDouble(upperl) - eta) * r - lambda;
  integralSupport = true;
  integralCoefficients = false;
  for (HighsInt i = 0; i != rowlen; ++i) {
    if (vals[i] == 0.0) continue;
    if (!isintegral[i]) {
      if (vals[i] < 0.0)
        integralSupport = false;
      else
        vals[i] = 0.0;
      continue;
    }

    if (coverflag[i]) {
      vals[i] = -phi_l(-vals[i]);
      rhs += vals[i] * upper[i];
    } else {
      vals[i] = gamma_l(vals[i]);
    }
  }

  return true;
}